

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

altsvc * altsvc_createid(char *srchost,char *dsthost,alpnid srcalpnid,alpnid dstalpnid,uint srcport,
                        uint dstport)

{
  unsigned_short uVar1;
  altsvc *as_00;
  char *pcVar2;
  size_t local_48;
  size_t dlen;
  size_t hlen;
  altsvc *as;
  uint dstport_local;
  uint srcport_local;
  alpnid dstalpnid_local;
  alpnid srcalpnid_local;
  char *dsthost_local;
  char *srchost_local;
  
  as_00 = (altsvc *)(*Curl_ccalloc)(1,0x50);
  if (as_00 != (altsvc *)0x0) {
    dlen = strlen(srchost);
    local_48 = strlen(dsthost);
    if ((dlen == 0) || (local_48 == 0)) {
      (*Curl_cfree)(as_00);
    }
    else {
      if ((dlen < 3) || (*srchost != '[')) {
        dsthost_local = srchost;
        if (srchost[dlen - 1] == '.') {
          dlen = dlen - 1;
        }
      }
      else {
        dsthost_local = srchost + 1;
        dlen = dlen - 2;
      }
      _dstalpnid_local = dsthost;
      if ((2 < local_48) && (*dsthost == '[')) {
        _dstalpnid_local = dsthost + 1;
        local_48 = local_48 - 2;
      }
      pcVar2 = (char *)Curl_memdup0(dsthost_local,dlen);
      (as_00->src).host = pcVar2;
      if ((as_00->src).host != (char *)0x0) {
        pcVar2 = (char *)Curl_memdup0(_dstalpnid_local,local_48);
        (as_00->dst).host = pcVar2;
        if ((as_00->dst).host != (char *)0x0) {
          (as_00->src).alpnid = srcalpnid;
          (as_00->dst).alpnid = dstalpnid;
          uVar1 = curlx_ultous((ulong)srcport);
          (as_00->src).port = uVar1;
          uVar1 = curlx_ultous((ulong)dstport);
          (as_00->dst).port = uVar1;
          return as_00;
        }
      }
      altsvc_free(as_00);
    }
  }
  return (altsvc *)0x0;
}

Assistant:

static struct altsvc *altsvc_createid(const char *srchost,
                                      const char *dsthost,
                                      enum alpnid srcalpnid,
                                      enum alpnid dstalpnid,
                                      unsigned int srcport,
                                      unsigned int dstport)
{
  struct altsvc *as = calloc(1, sizeof(struct altsvc));
  size_t hlen;
  size_t dlen;
  if(!as)
    return NULL;
  hlen = strlen(srchost);
  dlen = strlen(dsthost);
  DEBUGASSERT(hlen);
  DEBUGASSERT(dlen);
  if(!hlen || !dlen) {
    /* bad input */
    free(as);
    return NULL;
  }
  if((hlen > 2) && srchost[0] == '[') {
    /* IPv6 address, strip off brackets */
    srchost++;
    hlen -= 2;
  }
  else if(srchost[hlen - 1] == '.')
    /* strip off trailing dot */
    hlen--;
  if((dlen > 2) && dsthost[0] == '[') {
    /* IPv6 address, strip off brackets */
    dsthost++;
    dlen -= 2;
  }

  as->src.host = Curl_memdup0(srchost, hlen);
  if(!as->src.host)
    goto error;

  as->dst.host = Curl_memdup0(dsthost, dlen);
  if(!as->dst.host)
    goto error;

  as->src.alpnid = srcalpnid;
  as->dst.alpnid = dstalpnid;
  as->src.port = curlx_ultous(srcport);
  as->dst.port = curlx_ultous(dstport);

  return as;
error:
  altsvc_free(as);
  return NULL;
}